

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckDepth(BlitTest *this)

{
  deUint32 err;
  RenderContext *pRVar1;
  GLfloat extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  float fVar3;
  MessageBuilder local_1c0;
  uint local_40;
  uint local_3c;
  GLuint i;
  GLuint j;
  GLfloat depth [2] [3];
  Functions *gl;
  BlitTest *this_local;
  
  pRVar1 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  depth[1][1] = (GLfloat)(*pRVar1->_vptr_RenderContext[3])();
  depth[1][2] = extraout_var;
  memset(&i,0,0x18);
  (**(code **)(depth[1]._4_8_ + 0x1220))(0,0,3,2,0x1902,0x1406,&i);
  err = (**(code **)(depth[1]._4_8_ + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb96);
  local_3c = 0;
  do {
    if (1 < local_3c) {
      return true;
    }
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      fVar3 = de::abs<float>(CheckDepth::reference[local_3c][local_40] -
                             (float)(&i)[(ulong)local_3c * 3 + (ulong)local_40]);
      if (0.015625 < fVar3) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_1c0,(char (*) [44])"Blitted framebuffer depth buffer contains [")
        ;
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(float *)&i);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(float *)&j);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,depth[0]);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])", \n");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,depth[0] + 1);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,depth[0] + 2);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,depth[1]);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])"], but ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[0]);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[0] + 1);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[0] + 2);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])", \n");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[1]);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[1] + 1);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,CheckDepth::reference[1] + 2);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])0x2a7f041);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1c0);
        return false;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool BlitTest::CheckDepth()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3] = { { 0.5, 0.25, 0.125 }, { 0.0625, 0.0625, 0.0625 } };

	/* Copy buffer. */
	glw::GLfloat depth[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_DEPTH_COMPONENT, GL_FLOAT, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (de::abs(reference[j][i] - depth[j][i]) > (1.f / 64.f) /* Precision. */)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer depth buffer contains [" << depth[0][0] << ", "
					<< depth[0][1] << ", " << depth[0][2] << ", \n"
					<< depth[1][0] << ", " << depth[1][1] << ", " << depth[1][2] << "], but " << reference[0][0] << ", "
					<< reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}